

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
r_code::list<r_exec::MDLController::REntry>::push_front
          (list<r_exec::MDLController::REntry> *this,REntry *t)

{
  REntry *t_local;
  list<r_exec::MDLController::REntry> *this_local;
  
  if (this->free_cell_count == 0) {
    push_front_new_cell(this,t);
  }
  else {
    push_front_free_cell(this,t);
  }
  update_used_cells_head_state(this);
  return;
}

Assistant:

void push_front(const T &t)
    {
        if (free_cell_count) {
            push_front_free_cell(t);
        } else {
            push_front_new_cell(t);
        }

        update_used_cells_head_state();
    }